

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

Interval * __thiscall
tcu::FloatFormat::roundOut
          (Interval *__return_storage_ptr__,FloatFormat *this,Interval *x,bool roundUnderOverflow)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  Interval local_38;
  
  __return_storage_ptr__->m_hasNaN = x->m_hasNaN;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar4 = x->m_lo;
  if (dVar4 < x->m_hi || dVar4 == x->m_hi) {
    dVar4 = roundOut(this,dVar4,false,roundUnderOverflow);
    dVar5 = roundOut(this,x->m_hi,true,roundUnderOverflow);
    local_38.m_hasNaN = NAN(dVar4) || NAN(dVar5);
    uVar2 = -(ulong)NAN(dVar5);
    uVar3 = -(ulong)NAN(dVar4);
    dVar8 = (double)(uVar2 & 0x7ff0000000000000 | ~uVar2 & (ulong)dVar5);
    dVar9 = (double)(uVar3 & 0xfff0000000000000 | ~uVar3 & (ulong)dVar4);
    auVar7._0_8_ = uVar2 & 0xfff0000000000000;
    auVar7._8_8_ = uVar3 & 0x7ff0000000000000;
    auVar1._8_8_ = ~uVar3 & (ulong)dVar4;
    auVar1._0_8_ = ~uVar2 & (ulong)dVar5;
    auVar7 = auVar7 | auVar1;
    auVar6._0_8_ = auVar7._8_8_;
    auVar6._8_4_ = auVar7._0_4_;
    auVar6._12_4_ = auVar7._4_4_;
    uVar2 = -(ulong)(auVar6._0_8_ <= dVar8);
    uVar3 = -(ulong)(auVar6._8_8_ <= dVar9);
    local_38.m_lo = (double)(~uVar2 & (ulong)dVar8 | (ulong)auVar6._0_8_ & uVar2);
    local_38.m_hi = (double)(~uVar3 & auVar7._0_8_ | (ulong)dVar9 & uVar3);
    Interval::operator|=(__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval FloatFormat::roundOut (const Interval& x, bool roundUnderOverflow) const
{
	Interval ret = x.nan();

	if (!x.empty())
		ret |= Interval(roundOut(x.lo(), false, roundUnderOverflow),
						roundOut(x.hi(), true, roundUnderOverflow));

	return ret;
}